

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void check_number(char *str_num,char **num_end,LY_DATA_TYPE base)

{
  ushort **ppuVar1;
  LY_DATA_TYPE base_local;
  char **num_end_local;
  char *str_num_local;
  
  ppuVar1 = __ctype_b_loc();
  if (((((*ppuVar1)[(int)*str_num] & 0x800) == 0) && (*str_num != '-')) && (*str_num != '+')) {
    *num_end = str_num;
  }
  else {
    if ((*str_num == '-') || (num_end_local = (char **)str_num, *str_num == '+')) {
      num_end_local = (char **)(str_num + 1);
    }
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*(char *)num_end_local] & 0x800) != 0) {
      num_end_local = (char **)((long)num_end_local + 1);
    }
    if (((base == LY_TYPE_DEC64) && (*(char *)num_end_local == '.')) &&
       (ppuVar1 = __ctype_b_loc(),
       ((*ppuVar1)[(int)*(char *)((long)num_end_local + 1)] & 0x800) != 0)) {
      do {
        num_end_local = (char **)((long)num_end_local + 1);
        ppuVar1 = __ctype_b_loc();
      } while (((*ppuVar1)[(int)*(char *)num_end_local] & 0x800) != 0);
      *num_end = (char *)num_end_local;
    }
    else {
      *num_end = (char *)num_end_local;
    }
  }
  return;
}

Assistant:

static void
check_number(const char *str_num, const char **num_end, LY_DATA_TYPE base)
{
    if (!isdigit(str_num[0]) && (str_num[0] != '-') && (str_num[0] != '+')) {
        *num_end = str_num;
        return;
    }

    if ((str_num[0] == '-') || (str_num[0] == '+')) {
        ++str_num;
    }

    while (isdigit(str_num[0])) {
        ++str_num;
    }

    if ((base != LY_TYPE_DEC64) || (str_num[0] != '.') || !isdigit(str_num[1])) {
        *num_end = str_num;
        return;
    }

    ++str_num;
    while (isdigit(str_num[0])) {
        ++str_num;
    }

    *num_end = str_num;
}